

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::aggregator(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  bool bVar1;
  int col;
  pointer piVar2;
  HighsPostsolveStack *pHVar3;
  bool bVar4;
  int iVar5;
  HighsInt HVar6;
  Result RVar7;
  int iVar8;
  pair<int,_int> *ppVar9;
  const_iterator __first;
  const_iterator cVar10;
  int iVar11;
  pair<int,_int> *ppVar12;
  int *piVar13;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var14;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var15;
  size_t i;
  ulong uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  int local_6c;
  HPresolve *local_50;
  HighsPostsolveStack *local_48;
  HPresolveAnalysis *local_40;
  HPresolve *local_38;
  
  bVar1 = (this->analysis_).logging_on_;
  local_48 = postsolve_stack;
  if (bVar1 == true) {
    HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,0xc);
  }
  this_00 = &this->substitutionOpportunities;
  _Var14._M_current =
       (this->substitutionOpportunities).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  cVar10._M_current =
       (this->substitutionOpportunities).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar19 = (long)cVar10._M_current - (long)_Var14._M_current;
  local_50 = this;
  local_40 = &this->analysis_;
  local_38 = this;
  for (lVar17 = lVar19 >> 5; 0 < lVar17; lVar17 = lVar17 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
            operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                        *)&local_50,_Var14);
    _Var15._M_current = _Var14._M_current;
    if (bVar4) goto LAB_0030c70b;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
            operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                        *)&local_50,_Var14._M_current + 1);
    _Var15._M_current = _Var14._M_current + 1;
    if (bVar4) goto LAB_0030c70b;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
            operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                        *)&local_50,_Var14._M_current + 2);
    _Var15._M_current = _Var14._M_current + 2;
    if (bVar4) goto LAB_0030c70b;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
            operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                        *)&local_50,_Var14._M_current + 3);
    _Var15._M_current = _Var14._M_current + 3;
    if (bVar4) goto LAB_0030c70b;
    _Var14._M_current = _Var14._M_current + 4;
    lVar19 = lVar19 + -0x20;
  }
  lVar19 = lVar19 >> 3;
  if (lVar19 == 1) {
LAB_0030cb10:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
            operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                        *)&local_50,_Var14);
    _Var15._M_current = _Var14._M_current;
    if (!bVar4) {
      _Var15._M_current = cVar10._M_current;
    }
LAB_0030c70b:
    if (_Var15._M_current != cVar10._M_current) {
      _Var14._M_current = _Var15._M_current;
      while (ppVar9 = _Var14._M_current, _Var14._M_current = ppVar9 + 1,
            _Var14._M_current != cVar10._M_current) {
        bVar4 = __gnu_cxx::__ops::
                _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
                operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                            *)&local_38,_Var14);
        if (!bVar4) {
          (_Var15._M_current)->first = (_Var14._M_current)->first;
          (_Var15._M_current)->second = ppVar9[1].second;
          _Var15._M_current = _Var15._M_current + 1;
        }
      }
    }
  }
  else {
    if (lVar19 == 2) {
LAB_0030caf4:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)&local_50,_Var14);
      _Var15._M_current = _Var14._M_current;
      if (!bVar4) {
        _Var14._M_current = _Var14._M_current + 1;
        goto LAB_0030cb10;
      }
      goto LAB_0030c70b;
    }
    _Var15._M_current = cVar10._M_current;
    if (lVar19 == 3) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::$_0>::
              operator()((_Iter_pred<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__0>
                          *)&local_50,_Var14);
      _Var15._M_current = _Var14._M_current;
      if (!bVar4) {
        _Var14._M_current = _Var14._M_current + 1;
        goto LAB_0030caf4;
      }
      goto LAB_0030c70b;
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
            (this_00,(const_iterator)_Var15._M_current,cVar10);
  _Var14._M_current =
       (this->substitutionOpportunities).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var15._M_current =
       (this->substitutionOpportunities).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var14._M_current != _Var15._M_current) {
    iVar5 = pdqsort_detail::log2<long>((long)_Var15._M_current - (long)_Var14._M_current >> 3);
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
              (_Var14,_Var15,(anon_class_8_1_8991fb9c)this,iVar5,true);
  }
  uVar16 = 0;
  local_6c = 0;
  while( true ) {
    ppVar9 = (this->substitutionOpportunities).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    cVar10._M_current =
         (this->substitutionOpportunities).
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    lVar17 = (long)cVar10._M_current - (long)ppVar9;
    if ((ulong)(lVar17 >> 3) <= uVar16) break;
    ppVar12 = ppVar9 + uVar16;
    iVar5 = ppVar12->first;
    if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[iVar5] == '\0') {
      col = ppVar9[uVar16].second;
      if ((((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[col] != '\0') ||
          (bVar4 = isImpliedFree(this,col), !bVar4)) ||
         (bVar4 = isDualImpliedFree(this,iVar5), !bVar4)) goto LAB_0030c9bf;
      HVar6 = findNonzero(this,iVar5,col);
      if (HVar6 == -1) {
LAB_0030c9b4:
        ppVar12 = (this_00->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start + uVar16;
        goto LAB_0030c9bf;
      }
      if ((((this->model->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[col] != kInteger) ||
          (((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5] ==
            (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5] &&
           (bVar4 = rowCoefficientsIntegral
                              (this,iVar5,
                               1.0 / (this->Avalue).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[HVar6]), bVar4)))) ||
         (bVar4 = isImpliedIntegral(this,col), bVar4)) {
        iVar11 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar5];
        if ((iVar11 == 2) ||
           (iVar18 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[col], iVar18 == 2)) {
          storeRow(this,iVar5);
          pHVar3 = local_48;
          substituteFreeCol(this,local_48,iVar5,col,true);
          (this->substitutionOpportunities).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16].first = -1;
          RVar7 = removeRowSingletons(this,pHVar3);
          if (RVar7 != kOk) {
            return RVar7;
          }
          RVar7 = checkLimits(this,pHVar3);
        }
        else {
          if (iVar11 < iVar18) {
            dVar20 = getMaxAbsRowVal(this,iVar5);
          }
          else {
            dVar20 = getMaxAbsColVal(this,col);
          }
          dVar21 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[HVar6]);
          dVar22 = (this->options->super_HighsOptionsStruct).presolve_pivot_threshold;
          if (dVar21 < dVar20 * dVar22) {
            if ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar5] <
                (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[col]) {
              dVar20 = getMaxAbsColVal(this,col);
            }
            else {
              dVar20 = getMaxAbsRowVal(this,iVar5);
              dVar22 = (this->options->super_HighsOptionsStruct).presolve_pivot_threshold;
              dVar21 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[HVar6]);
            }
            if (dVar21 < dVar22 * dVar20) goto LAB_0030c9b4;
          }
          storeRow(this,iVar5);
          iVar11 = 1 - ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar5] +
                       (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[col]);
          piVar2 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar17 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[col];
          piVar13 = (int *)0x0;
          if (lVar17 != -1) {
            piVar13 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar17;
          }
          while (iVar18 = (int)lVar17, iVar18 != -1) {
            if (*piVar13 != iVar5) {
              HVar6 = countFillin(this,*piVar13);
              iVar11 = iVar11 + HVar6;
              iVar8 = (this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin;
              if (iVar8 < iVar11) goto LAB_0030ca70;
            }
            lVar17 = (long)piVar2[iVar18];
            piVar13 = piVar13 + (lVar17 - iVar18);
          }
          iVar8 = (this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin;
LAB_0030ca70:
          pHVar3 = local_48;
          if (iVar8 < iVar11) {
            local_6c = local_6c + 1;
            if (local_6c != 3) goto LAB_0030c9c2;
            ppVar9 = (this->substitutionOpportunities).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            cVar10._M_current =
                 (this->substitutionOpportunities).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            lVar17 = (long)cVar10._M_current - (long)ppVar9;
            break;
          }
          substituteFreeCol(this,local_48,iVar5,col,true);
          (this->substitutionOpportunities).
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16].first = -1;
          RVar7 = removeRowSingletons(this,pHVar3);
          if (RVar7 != kOk) {
            return RVar7;
          }
          RVar7 = checkLimits(this,pHVar3);
          local_6c = 0;
        }
        if (RVar7 != kOk) {
          return RVar7;
        }
      }
    }
    else {
LAB_0030c9bf:
      ppVar12->first = -1;
    }
LAB_0030c9c2:
    uVar16 = uVar16 + 1;
  }
  lVar19 = (long)cVar10._M_current - (long)ppVar9;
  for (lVar17 = lVar17 >> 5; 0 < lVar17; lVar17 = lVar17 + -1) {
    __first._M_current = ppVar9;
    if (ppVar9->first == -1) goto LAB_0030cbbe;
    if (ppVar9[1].first == -1) {
      __first._M_current = ppVar9 + 1;
      goto LAB_0030cbbe;
    }
    if (ppVar9[2].first == -1) {
      __first._M_current = ppVar9 + 2;
      goto LAB_0030cbbe;
    }
    if (ppVar9[3].first == -1) {
      __first._M_current = ppVar9 + 3;
      goto LAB_0030cbbe;
    }
    ppVar9 = ppVar9 + 4;
    lVar19 = lVar19 + -0x20;
  }
  lVar19 = lVar19 >> 3;
  if (lVar19 == 1) {
LAB_0030cba5:
    __first._M_current = ppVar9;
    if (ppVar9->first != -1) {
      __first._M_current = cVar10._M_current;
    }
  }
  else if (lVar19 == 2) {
LAB_0030cb9c:
    __first._M_current = ppVar9;
    if (ppVar9->first != -1) {
      ppVar9 = ppVar9 + 1;
      goto LAB_0030cba5;
    }
  }
  else {
    __first._M_current = cVar10._M_current;
    if (lVar19 != 3) goto LAB_0030cbef;
    __first._M_current = ppVar9;
    if (ppVar9->first != -1) {
      ppVar9 = ppVar9 + 1;
      goto LAB_0030cb9c;
    }
  }
LAB_0030cbbe:
  ppVar9 = __first._M_current;
  if (__first._M_current != cVar10._M_current) {
    while (ppVar12 = ppVar9, ppVar9 = ppVar12 + 1, ppVar9 != cVar10._M_current) {
      if (ppVar9->first != -1) {
        (__first._M_current)->first = ppVar9->first;
        (__first._M_current)->second = ppVar12[1].second;
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_0030cbef:
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
            (this_00,__first,cVar10);
  (this->analysis_).logging_on_ = bVar1;
  if (bVar1 != false) {
    HPresolveAnalysis::stopPresolveRuleLog(local_40,0xc);
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::aggregator(HighsPostsolveStack& postsolve_stack) {
  assert(analysis_.allow_rule_[kPresolveRuleAggregator]);
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleAggregator);
  substitutionOpportunities.erase(
      std::remove_if(substitutionOpportunities.begin(),
                     substitutionOpportunities.end(),
                     [&](const std::pair<HighsInt, HighsInt>& p) {
                       HighsInt row = p.first;
                       HighsInt col = p.second;
                       return rowDeleted[row] || colDeleted[col] ||
                              !isImpliedFree(col) || !isDualImpliedFree(row);
                     }),
      substitutionOpportunities.end());

  pdqsort(
      substitutionOpportunities.begin(), substitutionOpportunities.end(),
      [&](const std::pair<HighsInt, HighsInt>& nz1,
          const std::pair<HighsInt, HighsInt>& nz2) {
        HighsInt minLen1 = std::min(rowsize[nz1.first], colsize[nz1.second]);
        HighsInt minLen2 = std::min(rowsize[nz2.first], colsize[nz2.second]);
        if (minLen1 == 2 && minLen2 != 2) return true;
        if (minLen2 == 2 && minLen1 != 2) return false;

        int64_t sizeProd1 = int64_t(rowsize[nz1.first]) * colsize[nz1.second];
        int64_t sizeProd2 = int64_t(rowsize[nz2.first]) * colsize[nz2.second];
        if (sizeProd1 < sizeProd2) return true;
        if (sizeProd2 < sizeProd1) return false;
        if (minLen1 < minLen2) return true;
        if (minLen2 < minLen1) return false;

        return std::make_tuple(HighsHashHelpers::hash(std::make_pair(
                                   uint32_t(nz1.first), uint32_t(nz1.second))),
                               nz1.first, nz1.second) <
               std::make_tuple(HighsHashHelpers::hash(std::make_pair(
                                   uint32_t(nz2.first), uint32_t(nz2.second))),
                               nz2.first, nz2.second);
      });

  HighsInt nfail = 0;
  for (size_t i = 0; i < substitutionOpportunities.size(); ++i) {
    HighsInt row = substitutionOpportunities[i].first;
    HighsInt col = substitutionOpportunities[i].second;

    if (rowDeleted[row] || colDeleted[col] || !isImpliedFree(col) ||
        !isDualImpliedFree(row)) {
      substitutionOpportunities[i].first = -1;
      continue;
    }

    HighsInt nzPos = findNonzero(row, col);
    if (nzPos == -1) {
      substitutionOpportunities[i].first = -1;
      continue;
    }
    if (model->integrality_[col] == HighsVarType::kInteger) {
      bool impliedIntegral =
          (rowsizeInteger[row] == rowsize[row] &&
           rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos])) ||
          isImpliedIntegral(col);
      if (!impliedIntegral) continue;
    }

    // in the case where the row has length two or the column has length two
    // we always do the substitution since the fillin can never be problematic
    if (rowsize[row] == 2 || colsize[col] == 2) {
      storeRow(row);
      substituteFreeCol(postsolve_stack, row, col, true);
      substitutionOpportunities[i].first = -1;
      HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
      continue;
    }

    double maxVal = rowsize[row] < colsize[col] ? getMaxAbsRowVal(row)
                                                : getMaxAbsColVal(col);
    if (std::fabs(Avalue[nzPos]) < maxVal * options->presolve_pivot_threshold) {
      maxVal = rowsize[row] < colsize[col] ? getMaxAbsColVal(col)
                                           : getMaxAbsRowVal(row);
      if (std::fabs(Avalue[nzPos]) <
          maxVal * options->presolve_pivot_threshold) {
        substitutionOpportunities[i].first = -1;
        continue;
      }
    }

    storeRow(row);
    HighsInt fillin = -(rowsize[row] + colsize[col] - 1);
    for (const auto& nz : getColumnVector(col)) {
      if (nz.index() == row) continue;
      fillin += countFillin(nz.index());

      if (fillin > options->presolve_substitution_maxfillin) break;
    }

    if (fillin > options->presolve_substitution_maxfillin) {
      ++nfail;
      // if the fill in is too much for multiple tries, then we stop
      // as this indicates that the rows/columns are becoming too dense
      // for substitutions
      if (nfail == 3) break;
      continue;
    }

    nfail = 0;
    substituteFreeCol(postsolve_stack, row, col, true);
    substitutionOpportunities[i].first = -1;
    HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
    HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
  }

  substitutionOpportunities.erase(
      std::remove_if(
          substitutionOpportunities.begin(), substitutionOpportunities.end(),
          [](const std::pair<HighsInt, HighsInt>& p) { return p.first == -1; }),
      substitutionOpportunities.end());

  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleAggregator);
  return Result::kOk;
}